

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_active_cable_compliance(tcv_t *tcv,active_cable_compliance_t *compliance)

{
  byte bVar1;
  int iVar2;
  sfp_plus_cable_technology_t tech;
  undefined8 uStack_18;
  
  iVar2 = -4;
  if ((((compliance != (active_cable_compliance_t *)0x0 && tcv != (tcv_t *)0x0) &&
       (uStack_18 = 0xfffffffc, tcv->data != (void *)0x0)) &&
      (iVar2 = tcv_get_sfp_plus_cable_technology
                         (tcv,(sfp_plus_cable_technology_t *)((long)&uStack_18 + 7)), -1 < iVar2))
     && (iVar2 = -0xc, (uStack_18 & 0x100000000000000) != 0)) {
    compliance->bmp = '\0';
    bVar1 = *(byte *)((long)tcv->data + 0x3d) >> 3 & 1;
    compliance->bmp = bVar1;
    bVar1 = *(byte *)((long)tcv->data + 0x3d) >> 1 & 2 | bVar1;
    compliance->bmp = bVar1;
    bVar1 = *(char *)((long)tcv->data + 0x3d) * '\x02' & 4U | bVar1;
    compliance->bmp = bVar1;
    compliance->bmp = (*(byte *)((long)tcv->data + 0x3d) & 1) << 3 | bVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sfp_get_active_cable_compliance(tcv_t *tcv, active_cable_compliance_t *compliance)
{
	int ret;
	sfp_plus_cable_technology_t tech;

	if (tcv == NULL || compliance == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	ret = tcv_get_sfp_plus_cable_technology(tcv, &tech);
	if (ret < 0)
		return ret;

	/* Verify if the transceiver is passive cable */
	if (!tech.bits.active_cable)
		return TCV_ERR_FEATURE_NOT_AVAILABLE;

	/* Clear bitmap */
	compliance->bmp = 0;

	compliance->bits.fc_pi_4_limiting_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & FC_PI_4_LIMITING_COMPLIANT);

	compliance->bits.sff_8431_limiting_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & SFF_8431_LIMITING_COMPLIANT);

	compliance->bits.fc_pi_4_apndx_h_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & FC_PI_4_APENDIX_H_COMPLIANT);

	compliance->bits.sff_8431_apndx_e_compliant =
		!! (((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_WAVELENGTH] & SFF_8431_APENDIX_E_COMPLIANT);

	return 0;
}